

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reservoir_quantile.cpp
# Opt level: O3

void duckdb::DefineReservoirQuantile(AggregateFunctionSet *set,LogicalType *type)

{
  long lVar1;
  vector<duckdb::AggregateFunction,_true> *this;
  undefined8 *puVar2;
  aggregate_size_t *pp_Var3;
  byte bVar4;
  AggregateFunction fun;
  undefined1 local_750 [144];
  LogicalType LStack_6c0;
  FunctionStability local_6a8;
  FunctionNullHandling FStack_6a7;
  FunctionErrors FStack_6a6;
  FunctionCollationHandling FStack_6a5;
  undefined8 auStack_6a0 [14];
  element_type *local_630;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_628;
  AggregateFunction local_620;
  AggregateFunction local_4f0;
  AggregateFunction local_3c0;
  AggregateFunction local_290;
  AggregateFunction local_160;
  
  bVar4 = 0;
  GetReservoirQuantileAggregate((AggregateFunction *)local_750,type->physical_type_);
  SimpleFunction::SimpleFunction((SimpleFunction *)&local_620,(SimpleFunction *)local_750);
  local_620.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__BaseScalarFunction_02439fe0;
  LogicalType::LogicalType(&local_620.super_BaseScalarFunction.return_type,&LStack_6c0);
  local_620.super_BaseScalarFunction.stability = local_6a8;
  local_620.super_BaseScalarFunction.null_handling = FStack_6a7;
  local_620.super_BaseScalarFunction.errors = FStack_6a6;
  local_620.super_BaseScalarFunction.collation_handling = FStack_6a5;
  local_620.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__AggregateFunction_0243cea8;
  puVar2 = auStack_6a0;
  pp_Var3 = &local_620.state_size;
  for (lVar1 = 0xd; lVar1 != 0; lVar1 = lVar1 + -1) {
    *pp_Var3 = (aggregate_size_t)*puVar2;
    puVar2 = puVar2 + (ulong)bVar4 * -2 + 1;
    pp_Var3 = pp_Var3 + (ulong)bVar4 * -2 + 1;
  }
  local_620.order_dependent = (AggregateOrderDependent)auStack_6a0[0xd];
  local_620.distinct_dependent = auStack_6a0[0xd]._1_1_;
  local_620.function_info.internal.
  super___shared_ptr<duckdb::AggregateFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_630;
  local_620.function_info.internal.
  super___shared_ptr<duckdb::AggregateFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       local_628._M_pi;
  if (local_628._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_628._M_pi)->_M_use_count = (local_628._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_628._M_pi)->_M_use_count = (local_628._M_pi)->_M_use_count + 1;
    }
  }
  this = &(set->super_FunctionSet<duckdb::AggregateFunction>).functions;
  ::std::vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>::
  emplace_back<duckdb::AggregateFunction>
            (&this->
              super_vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>,
             &local_620);
  local_620.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__AggregateFunction_0243cea8;
  if (local_620.function_info.internal.
      super___shared_ptr<duckdb::AggregateFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_620.function_info.internal.
               super___shared_ptr<duckdb::AggregateFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  BaseScalarFunction::~BaseScalarFunction(&local_620.super_BaseScalarFunction);
  ::std::vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>>::
  emplace_back<duckdb::LogicalTypeId_const&>
            ((vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>> *)(local_750 + 0x48),
             &LogicalType::INTEGER);
  SimpleFunction::SimpleFunction((SimpleFunction *)&local_290,(SimpleFunction *)local_750);
  local_290.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__BaseScalarFunction_02439fe0;
  LogicalType::LogicalType(&local_290.super_BaseScalarFunction.return_type,&LStack_6c0);
  local_290.super_BaseScalarFunction.stability = local_6a8;
  local_290.super_BaseScalarFunction.null_handling = FStack_6a7;
  local_290.super_BaseScalarFunction.errors = FStack_6a6;
  local_290.super_BaseScalarFunction.collation_handling = FStack_6a5;
  local_290.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__AggregateFunction_0243cea8;
  puVar2 = auStack_6a0;
  pp_Var3 = &local_290.state_size;
  for (lVar1 = 0xd; lVar1 != 0; lVar1 = lVar1 + -1) {
    *pp_Var3 = (aggregate_size_t)*puVar2;
    puVar2 = puVar2 + (ulong)bVar4 * -2 + 1;
    pp_Var3 = pp_Var3 + (ulong)bVar4 * -2 + 1;
  }
  local_290.order_dependent = (AggregateOrderDependent)auStack_6a0[0xd];
  local_290.distinct_dependent = auStack_6a0[0xd]._1_1_;
  local_290.function_info.internal.
  super___shared_ptr<duckdb::AggregateFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_630;
  local_290.function_info.internal.
  super___shared_ptr<duckdb::AggregateFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       local_628._M_pi;
  if (local_628._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_628._M_pi)->_M_use_count = (local_628._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_628._M_pi)->_M_use_count = (local_628._M_pi)->_M_use_count + 1;
    }
  }
  ::std::vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>::
  emplace_back<duckdb::AggregateFunction>
            (&this->
              super_vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>,
             &local_290);
  local_290.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__AggregateFunction_0243cea8;
  if (local_290.function_info.internal.
      super___shared_ptr<duckdb::AggregateFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_290.function_info.internal.
               super___shared_ptr<duckdb::AggregateFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  BaseScalarFunction::~BaseScalarFunction(&local_290.super_BaseScalarFunction);
  GetReservoirQuantileListAggregate(&local_160,type);
  AggregateFunction::operator=((AggregateFunction *)local_750,&local_160);
  local_160.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__AggregateFunction_0243cea8;
  if (local_160.function_info.internal.
      super___shared_ptr<duckdb::AggregateFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_160.function_info.internal.
               super___shared_ptr<duckdb::AggregateFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  BaseScalarFunction::~BaseScalarFunction(&local_160.super_BaseScalarFunction);
  SimpleFunction::SimpleFunction((SimpleFunction *)&local_3c0,(SimpleFunction *)local_750);
  local_3c0.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__BaseScalarFunction_02439fe0;
  LogicalType::LogicalType(&local_3c0.super_BaseScalarFunction.return_type,&LStack_6c0);
  local_3c0.super_BaseScalarFunction.stability = local_6a8;
  local_3c0.super_BaseScalarFunction.null_handling = FStack_6a7;
  local_3c0.super_BaseScalarFunction.errors = FStack_6a6;
  local_3c0.super_BaseScalarFunction.collation_handling = FStack_6a5;
  local_3c0.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__AggregateFunction_0243cea8;
  puVar2 = auStack_6a0;
  pp_Var3 = &local_3c0.state_size;
  for (lVar1 = 0xd; lVar1 != 0; lVar1 = lVar1 + -1) {
    *pp_Var3 = (aggregate_size_t)*puVar2;
    puVar2 = puVar2 + (ulong)bVar4 * -2 + 1;
    pp_Var3 = pp_Var3 + (ulong)bVar4 * -2 + 1;
  }
  local_3c0.order_dependent = (AggregateOrderDependent)auStack_6a0[0xd];
  local_3c0.distinct_dependent = auStack_6a0[0xd]._1_1_;
  local_3c0.function_info.internal.
  super___shared_ptr<duckdb::AggregateFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_630;
  local_3c0.function_info.internal.
  super___shared_ptr<duckdb::AggregateFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       local_628._M_pi;
  if (local_628._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_628._M_pi)->_M_use_count = (local_628._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_628._M_pi)->_M_use_count = (local_628._M_pi)->_M_use_count + 1;
    }
  }
  ::std::vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>::
  emplace_back<duckdb::AggregateFunction>
            (&this->
              super_vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>,
             &local_3c0);
  local_3c0.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__AggregateFunction_0243cea8;
  if (local_3c0.function_info.internal.
      super___shared_ptr<duckdb::AggregateFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_3c0.function_info.internal.
               super___shared_ptr<duckdb::AggregateFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  BaseScalarFunction::~BaseScalarFunction(&local_3c0.super_BaseScalarFunction);
  ::std::vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>>::
  emplace_back<duckdb::LogicalTypeId_const&>
            ((vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>> *)(local_750 + 0x48),
             &LogicalType::INTEGER);
  SimpleFunction::SimpleFunction((SimpleFunction *)&local_4f0,(SimpleFunction *)local_750);
  local_4f0.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__BaseScalarFunction_02439fe0;
  LogicalType::LogicalType(&local_4f0.super_BaseScalarFunction.return_type,&LStack_6c0);
  local_4f0.super_BaseScalarFunction.stability = local_6a8;
  local_4f0.super_BaseScalarFunction.null_handling = FStack_6a7;
  local_4f0.super_BaseScalarFunction.errors = FStack_6a6;
  local_4f0.super_BaseScalarFunction.collation_handling = FStack_6a5;
  local_4f0.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__AggregateFunction_0243cea8;
  puVar2 = auStack_6a0;
  pp_Var3 = &local_4f0.state_size;
  for (lVar1 = 0xd; lVar1 != 0; lVar1 = lVar1 + -1) {
    *pp_Var3 = (aggregate_size_t)*puVar2;
    puVar2 = puVar2 + (ulong)bVar4 * -2 + 1;
    pp_Var3 = pp_Var3 + (ulong)bVar4 * -2 + 1;
  }
  local_4f0.order_dependent = (AggregateOrderDependent)auStack_6a0[0xd];
  local_4f0.distinct_dependent = auStack_6a0[0xd]._1_1_;
  local_4f0.function_info.internal.
  super___shared_ptr<duckdb::AggregateFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_630;
  local_4f0.function_info.internal.
  super___shared_ptr<duckdb::AggregateFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       local_628._M_pi;
  if (local_628._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_628._M_pi)->_M_use_count = (local_628._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_628._M_pi)->_M_use_count = (local_628._M_pi)->_M_use_count + 1;
    }
  }
  ::std::vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>::
  emplace_back<duckdb::AggregateFunction>
            (&this->
              super_vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>,
             &local_4f0);
  local_4f0.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__AggregateFunction_0243cea8;
  if (local_4f0.function_info.internal.
      super___shared_ptr<duckdb::AggregateFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_4f0.function_info.internal.
               super___shared_ptr<duckdb::AggregateFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  BaseScalarFunction::~BaseScalarFunction(&local_4f0.super_BaseScalarFunction);
  local_750._0_8_ = &PTR__AggregateFunction_0243cea8;
  if (local_628._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_628._M_pi);
  }
  BaseScalarFunction::~BaseScalarFunction((BaseScalarFunction *)local_750);
  return;
}

Assistant:

static void DefineReservoirQuantile(AggregateFunctionSet &set, const LogicalType &type) {
	//	Four versions: type, scalar/list[, count]
	auto fun = GetReservoirQuantileAggregate(type.InternalType());
	set.AddFunction(fun);

	fun.arguments.emplace_back(LogicalType::INTEGER);
	set.AddFunction(fun);

	// List variants
	fun = GetReservoirQuantileListAggregate(type);
	set.AddFunction(fun);

	fun.arguments.emplace_back(LogicalType::INTEGER);
	set.AddFunction(fun);
}